

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONConfigurePresets.cxx
# Opt level: O3

function<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::ConfigurePreset_&,_const_Json::Value_*)>
* anon_unknown.dwarf_dbab10::ArchToolsetHelper
            (function<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::ConfigurePreset_&,_const_Json::Value_*)>
             *__return_storage_ptr__,offset_in_ConfigurePreset_to_string valueField,
            offset_in_ConfigurePreset_to_optional<cmCMakePresetsGraph::ArchToolsetStrategy>
            strategyField)

{
  pointer *this;
  undefined8 uVar1;
  Object<cmCMakePresetsGraph::ConfigurePreset> *pOVar2;
  offset_in_ConfigurePreset_to_string *poVar3;
  function<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::ConfigurePreset_&,_const_Json::Value_*)>
  *extraout_RAX;
  Object<cmCMakePresetsGraph::ConfigurePreset> objectHelper;
  Object<cmCMakePresetsGraph::ConfigurePreset> local_a8;
  undefined5 local_80;
  undefined3 uStack_7b;
  undefined5 uStack_78;
  vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member>_>
  local_70;
  undefined5 local_58;
  undefined3 uStack_53;
  undefined5 uStack_50;
  string_view local_48;
  string_view local_38;
  
  local_a8.Members.
  super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_a8._17_8_ = 0;
  local_a8.Members.
  super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.Members.
  super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_a8.Members.
  super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_a8.Success = READ_OK;
  local_a8.Fail = INVALID_PRESET;
  local_a8.AllowExtra = false;
  local_38._M_len = 5;
  local_38._M_str = "value";
  pOVar2 = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
           Object<cmCMakePresetsGraph::ConfigurePreset>::
           Bind<cmCMakePresetsGraph::ConfigurePreset,std::__cxx11::string,cmCMakePresetsGraph::ReadFileResult(*)(std::__cxx11::string&,Json::Value_const*)>
                     (&local_a8,&local_38,valueField,cmCMakePresetsGraphInternal::PresetStringHelper
                      ,false);
  local_48._M_len = 8;
  local_48._M_str = "strategy";
  pOVar2 = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
           Object<cmCMakePresetsGraph::ConfigurePreset>::
           Bind<cmCMakePresetsGraph::ConfigurePreset,std::optional<cmCMakePresetsGraph::ArchToolsetStrategy>,cmCMakePresetsGraph::ReadFileResult(*)(std::optional<cmCMakePresetsGraph::ArchToolsetStrategy>&,Json::Value_const*)>
                     (pOVar2,&local_48,strategyField,ArchToolsetStrategyHelper,false);
  std::
  vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member>_>
  ::vector(&local_70,&pOVar2->Members);
  uVar1._0_1_ = pOVar2->AnyRequired;
  uVar1._1_3_ = *(undefined3 *)&pOVar2->field_0x19;
  uVar1._4_4_ = pOVar2->Success;
  uStack_50 = (undefined5)((ulong)*(undefined8 *)((long)&pOVar2->Success + 1) >> 0x18);
  local_58 = (undefined5)uVar1;
  uStack_53 = (undefined3)((uint)uVar1._4_4_ >> 8);
  std::
  vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member>_>
  ::~vector(&local_a8.Members);
  local_a8.Members.
  super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = (undefined1)strategyField;
  local_a8.Members.
  super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = (undefined7)(strategyField >> 8);
  this = &local_a8.Members.
          super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_a8.Members.
  super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)valueField;
  std::
  vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member>_>
  ::vector((vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member>_>
            *)this,&local_70);
  uStack_78 = uStack_50;
  local_80 = local_58;
  uStack_7b = uStack_53;
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  poVar3 = (offset_in_ConfigurePreset_to_string *)operator_new(0x38);
  *poVar3 = (offset_in_ConfigurePreset_to_string)
            local_a8.Members.
            super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member>_>
            ._M_impl.super__Vector_impl_data._M_start;
  poVar3[1] = CONCAT71(local_a8.Members.
                       super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member>_>
                       ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                       local_a8.Members.
                       super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member>_>
                       ._M_impl.super__Vector_impl_data._M_finish._0_1_);
  std::
  vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member>_>
  ::vector((vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member>_>
            *)(poVar3 + 2),
           (vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member>_>
            *)this);
  *(ulong *)((long)poVar3 + 0x2d) = CONCAT53(uStack_78,uStack_7b);
  poVar3[5] = CONCAT35(uStack_7b,local_80);
  *(offset_in_ConfigurePreset_to_string **)
   &(__return_storage_ptr__->super__Function_base)._M_functor = poVar3;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::ConfigurePreset_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraphReadJSONConfigurePresets.cxx:62:10)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::ConfigurePreset_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraphReadJSONConfigurePresets.cxx:62:10)>
       ::_M_manager;
  std::
  vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member>_>
  ::~vector((vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member>_>
             *)this);
  std::
  vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member>_>
  ::~vector(&local_70);
  return extraout_RAX;
}

Assistant:

std::function<ReadFileResult(ConfigurePreset&, const Json::Value*)>
ArchToolsetHelper(
  std::string ConfigurePreset::*valueField,
  cm::optional<ArchToolsetStrategy> ConfigurePreset::*strategyField)
{
  auto const objectHelper =
    JSONHelperBuilder::Object<ConfigurePreset>(
      ReadFileResult::READ_OK, ReadFileResult::INVALID_PRESET, false)
      .Bind("value", valueField,
            cmCMakePresetsGraphInternal::PresetStringHelper, false)
      .Bind("strategy", strategyField, ArchToolsetStrategyHelper, false);
  return [valueField, strategyField, objectHelper](
           ConfigurePreset& out, const Json::Value* value) -> ReadFileResult {
    if (!value) {
      (out.*valueField).clear();
      out.*strategyField = cm::nullopt;
      return ReadFileResult::READ_OK;
    }

    if (value->isString()) {
      out.*valueField = value->asString();
      out.*strategyField = cm::nullopt;
      return ReadFileResult::READ_OK;
    }

    if (value->isObject()) {
      return objectHelper(out, value);
    }

    return ReadFileResult::INVALID_PRESET;
  };
}